

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key_tests.cpp
# Opt level: O0

void key_tests::CmpSerializationPubkey(CPubKey *pubkey)

{
  bool bVar1;
  unit_test_log_t *in_RDI;
  long in_FS_OFFSET;
  DataStream stream;
  CPubKey pubkey2;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  DataStream *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  CPubKey *a;
  const_string *msg;
  size_t in_stack_fffffffffffffef8;
  const_string *in_stack_ffffffffffffff00;
  const_string local_f0 [2];
  lazy_ostream local_d0 [2];
  assertion_result local_b0 [2];
  const_string local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_68 = 0;
  uStack_60 = 0;
  local_78.m_begin = (iterator)0x0;
  local_78.m_end = (iterator)0x0;
  msg = &local_78;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffffec8);
  DataStream::operator<<
            (in_stack_fffffffffffffed8,
             (CPubKey *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  CPubKey::CPubKey((CPubKey *)in_stack_fffffffffffffec8);
  DataStream::operator>>
            (in_stack_fffffffffffffed8,
             (CPubKey *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
  do {
    a = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffed8,
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffec8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_RDI,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,msg);
    in_stack_fffffffffffffee7 =
         ::operator==(a,(CPubKey *)CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffed8,(bool)in_stack_fffffffffffffed7);
    in_stack_fffffffffffffed8 = (DataStream *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffed8,
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffec8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffed8,
               (pointer)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (unsigned_long)in_stack_fffffffffffffec8);
    in_stack_fffffffffffffec8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_b0,local_d0,local_f0,0xeb,CHECK,CHECK_PRED)
    ;
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffec8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffec8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffffec8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CmpSerializationPubkey(const CPubKey& pubkey)
{
    DataStream stream{};
    stream << pubkey;
    CPubKey pubkey2;
    stream >> pubkey2;
    BOOST_CHECK(pubkey == pubkey2);
}